

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

Expression * wasm::Properties::getSignExtValue(Expression *curr)

{
  Id IVar1;
  bool bVar2;
  Expression *in_RAX;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_f8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_b8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_78;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_50;
  undefined8 local_40;
  undefined4 local_38;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_30;
  Expression *local_18;
  Expression *extended;
  int32_t leftShift;
  int32_t rightShift;
  
  if ((curr->type).id == 2) {
    IVar1 = curr->_id;
    local_18 = in_RAX;
    if (IVar1 == UnaryId) {
      if (curr[1]._id - TableSizeId < 2) {
        local_18 = (Expression *)curr[1].type.id;
      }
      else {
        local_18 = (Expression *)0x0;
      }
    }
    if (IVar1 != UnaryId) {
      local_f8.submatchers.curr.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<int>_> *)&extended;
      extended._0_4_ = 0;
      local_b8.submatchers.curr.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<int>_> *)((long)&extended + 4);
      extended._4_4_ = 0;
      local_50.binder = &local_18;
      local_18 = (Expression *)0x0;
      local_78.submatchers.curr = &local_50;
      local_78.submatchers.next.curr = &local_f8;
      local_f8.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_f8.binder = (matched_t<wasm::Const_*> *)0x0;
      local_30.curr = &local_78;
      local_78.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
      local_78.data = ShlInt32;
      local_30.next.curr = &local_b8;
      local_b8.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_b8.binder = (matched_t<wasm::Const_*> *)0x0;
      local_40 = 0;
      local_38 = 0xb;
      if ((((IVar1 != BinaryId) || (curr[1]._id != GlobalSetId)) ||
          (bVar2 = Match::Internal::
                   Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                   ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                            )curr,&local_30), !bVar2)) ||
         (((int)extended != extended._4_4_ || ((int)extended == 0)))) {
        local_18 = (Expression *)0x0;
      }
    }
    return local_18;
  }
  return (Expression *)0x0;
}

Assistant:

bool operator!=(const BasicType& other) const { return id != other; }